

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_follow(Curl_easy *data,char *newurl,followtype type)

{
  int *piVar1;
  undefined1 *puVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  curl_trc_feat *pcVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  CURLUcode CVar12;
  CURLcode CVar13;
  CURLU *pCVar14;
  size_t sVar15;
  char *pcVar16;
  Curl_handler *pCVar17;
  uint uVar18;
  followtype fVar19;
  CURLU **ppCVar20;
  bool bVar21;
  char *newurl_local;
  undefined4 local_44;
  char *scheme;
  char *referer;
  
  fVar19 = FOLLOW_FAKE;
  newurl_local = newurl;
  if (type == FOLLOW_FAKE) {
LAB_00157f69:
    local_44 = 0;
    type = fVar19;
LAB_001580d2:
    iVar4 = (data->req).httpcode;
    bVar21 = false;
    if ((iVar4 != 0x191) && (bVar21 = false, iVar4 != 0x197)) {
      sVar15 = Curl_is_absolute_url(newurl_local,(char *)0x0,0,false);
      bVar21 = sVar15 != 0;
    }
    pCVar14 = (data->state).uh;
    if (type != FOLLOW_FAKE) {
      uVar18 = 0x800;
      if (type == FOLLOW_REDIR) {
        uVar18 = 0x880;
      }
      goto LAB_0015812b;
    }
    uVar18 = 8;
    bVar10 = true;
    bVar11 = false;
  }
  else {
    piVar1 = &(data->state).requests;
    *piVar1 = *piVar1 + 1;
    if (type != FOLLOW_RETRY) {
      if (type == FOLLOW_REDIR) {
        lVar6 = (data->set).maxredirs;
        lVar7 = (data->state).followlocation;
        local_44 = (undefined4)CONCAT71((int7)((ulong)newurl >> 8),1);
        type = fVar19;
        if (lVar7 < lVar6 || lVar6 == -1) {
          (data->state).followlocation = lVar7 + 1;
          fVar19 = FOLLOW_REDIR;
          if (((data->set).field_0x8cd & 4) != 0) {
            referer = (char *)0x0;
            if (((data->state).field_0x745 & 0x80) != 0) {
              (*Curl_cfree)((data->state).referer);
              (data->state).referer = (char *)0x0;
              puVar2 = &(data->state).field_0x745;
              *puVar2 = *puVar2 & 0x7f;
            }
            pCVar14 = curl_url();
            if (pCVar14 == (CURLU *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            bVar21 = false;
            CVar12 = curl_url_set(pCVar14,CURLUPART_URL,(data->state).url,0);
            if (CVar12 == CURLUE_OK) {
              bVar21 = false;
              CVar12 = curl_url_set(pCVar14,CURLUPART_FRAGMENT,(char *)0x0,0);
              if (CVar12 == CURLUE_OK) {
                bVar21 = false;
                CVar12 = curl_url_set(pCVar14,CURLUPART_USER,(char *)0x0,0);
                if (CVar12 == CURLUE_OK) {
                  bVar21 = false;
                  CVar12 = curl_url_set(pCVar14,CURLUPART_PASSWORD,(char *)0x0,0);
                  if (CVar12 == CURLUE_OK) {
                    CVar12 = curl_url_get(pCVar14,CURLUPART_URL,&referer,0);
                    bVar21 = CVar12 == CURLUE_OK;
                  }
                }
              }
            }
            curl_url_cleanup(pCVar14);
            if (!(bool)(referer != (char *)0x0 & bVar21)) {
              return CURLE_OUT_OF_MEMORY;
            }
            (data->state).referer = referer;
            puVar2 = &(data->state).field_0x745;
            *puVar2 = *puVar2 | 0x80;
          }
          goto LAB_00157f69;
        }
      }
      else {
        local_44 = 0;
      }
      goto LAB_001580d2;
    }
    pCVar14 = (data->state).uh;
    uVar18 = 0x800;
    local_44 = 0;
    bVar21 = false;
LAB_0015812b:
    uVar18 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x25) & 0x10 | uVar18;
    bVar11 = true;
    bVar10 = false;
  }
  ppCVar20 = &(data->state).uh;
  CVar12 = curl_url_set(pCVar14,CURLUPART_URL,newurl_local,uVar18);
  if (CVar12 != CURLUE_OK) {
    if (!bVar10) {
      pcVar16 = curl_url_strerror(CVar12);
      Curl_failf(data,"The redirect target URL could not be parsed: %s",pcVar16);
      goto LAB_001581ba;
    }
    newurl_local = (*Curl_cstrdup)(newurl_local);
    if (newurl_local == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    goto LAB_00158335;
  }
  CVar12 = curl_url_get(*ppCVar20,CURLUPART_URL,&newurl_local,0);
  if (CVar12 != CURLUE_OK) goto LAB_001581ba;
  if (bVar11 && -1 < (char)(data->set).field_0x8cc) {
    uVar3 = (data->set).use_port;
    uVar18 = (uint)uVar3;
    if ((uVar3 == 0) || (((data->state).field_0x744 & 0x10) == 0)) {
      CVar12 = curl_url_get(*ppCVar20,CURLUPART_PORT,&referer,1);
      pcVar16 = referer;
      if (CVar12 == CURLUE_OK) {
        uVar18 = atoi(referer);
        (*Curl_cfree)(pcVar16);
        goto LAB_00158220;
      }
LAB_00158240:
      (*Curl_cfree)(newurl_local);
LAB_001581ba:
      CVar13 = Curl_uc_to_curlcode(CVar12);
      return CVar13;
    }
LAB_00158220:
    uVar5 = (data->info).conn_remote_port;
    if (uVar18 == uVar5) {
      CVar12 = curl_url_get(*ppCVar20,CURLUPART_SCHEME,&scheme,0);
      if (CVar12 != CURLUE_OK) goto LAB_00158240;
      pCVar17 = Curl_get_scheme_handler(scheme);
      if ((pCVar17 == (Curl_handler *)0x0) || (pCVar17->protocol == (data->info).conn_protocol)) {
        (*Curl_cfree)(scheme);
        goto LAB_0015832b;
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
      {
        Curl_infof(data,"Clear auth, redirects scheme from %s to %s",(data->info).conn_scheme,scheme
                  );
      }
      (*Curl_cfree)(scheme);
    }
    else if ((((data->set).field_0x8cd & 0x10) != 0) &&
            ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)
             ))) {
      Curl_infof(data,"Clear auth, redirects to port from %u to %u",(ulong)uVar5,(ulong)uVar18);
    }
    (*Curl_cfree)((data->state).aptr.user);
    (data->state).aptr.user = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.passwd);
    (data->state).aptr.passwd = (char *)0x0;
  }
LAB_0015832b:
  if (bVar10) {
LAB_00158335:
    (data->info).wouldredirect = newurl_local;
    CVar13 = CURLE_OK;
    if ((char)local_44 != '\0') {
      Curl_failf(data,"Maximum (%ld) redirects followed",(data->set).maxredirs);
      CVar13 = CURLE_TOO_MANY_REDIRECTS;
    }
    return CVar13;
  }
  uVar18 = *(uint *)&(data->state).field_0x744;
  if (bVar21) {
    uVar18 = uVar18 & 0xffffffef;
    *(uint *)&(data->state).field_0x744 = uVar18;
  }
  if ((uVar18 >> 0xe & 1) != 0) {
    (*Curl_cfree)((data->state).url);
    uVar18 = *(uint *)&(data->state).field_0x744;
  }
  (data->state).url = newurl_local;
  *(uint *)&(data->state).field_0x744 = uVar18 | 0x4000;
  Curl_req_soft_reset(&data->req,data);
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)))) {
    Curl_infof(data,"Issue another request to this URL: \'%s\'",(data->state).url);
  }
  iVar4 = (data->info).httpcode;
  if (iVar4 == 0x12f) {
    bVar9 = (data->state).httpreq;
    if (bVar9 - 1 < 3) {
      if (((data->set).keep_post & 4U) != 0) goto LAB_00158500;
    }
    else if (bVar9 == 0) goto LAB_00158500;
    (data->state).httpreq = '\0';
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)))) {
      pcVar16 = "HEAD";
      if ((*(uint *)&(data->req).field_0xd9 >> 0x11 & 1) == 0) {
        pcVar16 = "GET";
      }
      Curl_infof(data,"Switch to %s",pcVar16);
    }
  }
  else {
    if (iVar4 == 0x12e) {
      if (2 < (byte)((data->state).httpreq - 1)) goto LAB_00158500;
      bVar9 = (data->set).keep_post & 2;
    }
    else {
      if ((iVar4 != 0x12d) || (2 < (byte)((data->state).httpreq - 1))) goto LAB_00158500;
      bVar9 = (data->set).keep_post & 1;
    }
    if (bVar9 == 0) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
      {
        Curl_infof(data,"Switch from POST to GET");
      }
      (data->state).httpreq = '\0';
      Curl_creader_set_rewind(data,false);
    }
  }
LAB_00158500:
  Curl_pgrsTime(data,TIMER_REDIRECT);
  Curl_pgrsResetTransferSizes(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_follow(struct Curl_easy *data,
                     char *newurl,    /* the Location: string */
                     followtype type) /* see transfer.h */
{
#ifdef CURL_DISABLE_HTTP
  (void)data;
  (void)newurl;
  (void)type;
  /* Location: following will not happen when HTTP is disabled */
  return CURLE_TOO_MANY_REDIRECTS;
#else

  /* Location: redirect */
  bool disallowport = FALSE;
  bool reachedmax = FALSE;
  CURLUcode uc;

  DEBUGASSERT(type != FOLLOW_NONE);

  if(type != FOLLOW_FAKE)
    data->state.requests++; /* count all real follows */
  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
       (data->state.followlocation >= data->set.maxredirs)) {
      reachedmax = TRUE;
      type = FOLLOW_FAKE; /* switch to fake to store the would-be-redirected
                             to URL */
    }
    else {
      data->state.followlocation++; /* count redirect-followings, including
                                       auth reloads */

      if(data->set.http_auto_referer) {
        CURLU *u;
        char *referer = NULL;

        /* We are asked to automatically set the previous URL as the referer
           when we get the next URL. We pick the ->url field, which may or may
           not be 100% correct */

        if(data->state.referer_alloc) {
          Curl_safefree(data->state.referer);
          data->state.referer_alloc = FALSE;
        }

        /* Make a copy of the URL without credentials and fragment */
        u = curl_url();
        if(!u)
          return CURLE_OUT_OF_MEMORY;

        uc = curl_url_set(u, CURLUPART_URL, data->state.url, 0);
        if(!uc)
          uc = curl_url_set(u, CURLUPART_FRAGMENT, NULL, 0);
        if(!uc)
          uc = curl_url_set(u, CURLUPART_USER, NULL, 0);
        if(!uc)
          uc = curl_url_set(u, CURLUPART_PASSWORD, NULL, 0);
        if(!uc)
          uc = curl_url_get(u, CURLUPART_URL, &referer, 0);

        curl_url_cleanup(u);

        if(uc || !referer)
          return CURLE_OUT_OF_MEMORY;

        data->state.referer = referer;
        data->state.referer_alloc = TRUE; /* yes, free this later */
      }
    }
  }

  if((type != FOLLOW_RETRY) &&
     (data->req.httpcode != 401) && (data->req.httpcode != 407) &&
     Curl_is_absolute_url(newurl, NULL, 0, FALSE)) {
    /* If this is not redirect due to a 401 or 407 response and an absolute
       URL: do not allow a custom port number */
    disallowport = TRUE;
  }

  DEBUGASSERT(data->state.uh);
  uc = curl_url_set(data->state.uh, CURLUPART_URL, newurl, (unsigned int)
                    ((type == FOLLOW_FAKE) ? CURLU_NON_SUPPORT_SCHEME :
                     ((type == FOLLOW_REDIR) ? CURLU_URLENCODE : 0) |
                     CURLU_ALLOW_SPACE |
                     (data->set.path_as_is ? CURLU_PATH_AS_IS : 0)));
  if(uc) {
    if(type != FOLLOW_FAKE) {
      failf(data, "The redirect target URL could not be parsed: %s",
            curl_url_strerror(uc));
      return Curl_uc_to_curlcode(uc);
    }

    /* the URL could not be parsed for some reason, but since this is FAKE
       mode, just duplicate the field as-is */
    newurl = strdup(newurl);
    if(!newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else {
    uc = curl_url_get(data->state.uh, CURLUPART_URL, &newurl, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);

    /* Clear auth if this redirects to a different port number or protocol,
       unless permitted */
    if(!data->set.allow_auth_to_other_hosts && (type != FOLLOW_FAKE)) {
      char *portnum;
      int port;
      bool clear = FALSE;

      if(data->set.use_port && data->state.allow_port)
        /* a custom port is used */
        port = (int)data->set.use_port;
      else {
        uc = curl_url_get(data->state.uh, CURLUPART_PORT, &portnum,
                          CURLU_DEFAULT_PORT);
        if(uc) {
          free(newurl);
          return Curl_uc_to_curlcode(uc);
        }
        port = atoi(portnum);
        free(portnum);
      }
      if(port != data->info.conn_remote_port) {
        infof(data, "Clear auth, redirects to port from %u to %u",
              data->info.conn_remote_port, port);
        clear = TRUE;
      }
      else {
        char *scheme;
        const struct Curl_handler *p;
        uc = curl_url_get(data->state.uh, CURLUPART_SCHEME, &scheme, 0);
        if(uc) {
          free(newurl);
          return Curl_uc_to_curlcode(uc);
        }

        p = Curl_get_scheme_handler(scheme);
        if(p && (p->protocol != data->info.conn_protocol)) {
          infof(data, "Clear auth, redirects scheme from %s to %s",
                data->info.conn_scheme, scheme);
          clear = TRUE;
        }
        free(scheme);
      }
      if(clear) {
        Curl_safefree(data->state.aptr.user);
        Curl_safefree(data->state.aptr.passwd);
      }
    }
  }

  if(type == FOLLOW_FAKE) {
    /* we are only figuring out the new URL if we would have followed locations
       but now we are done so we can get out! */
    data->info.wouldredirect = newurl;

    if(reachedmax) {
      failf(data, "Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->state.url_alloc)
    Curl_safefree(data->state.url);

  data->state.url = newurl;
  data->state.url_alloc = TRUE;
  Curl_req_soft_reset(&data->req, data);
  infof(data, "Issue another request to this URL: '%s'", data->state.url);

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * an HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I have checked RFC2616 and
     * they seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC7231, section 6.4.2)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request. If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behavior is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->state.httpreq == HTTPREQ_POST
        || data->state.httpreq == HTTPREQ_POST_FORM
        || data->state.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_301)) {
      infof(data, "Switch from POST to GET");
      data->state.httpreq = HTTPREQ_GET;
      Curl_creader_set_rewind(data, FALSE);
    }
    break;
  case 302: /* Found */
    /* (quote from RFC7231, section 6.4.3)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request. If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behavior is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->state.httpreq == HTTPREQ_POST
        || data->state.httpreq == HTTPREQ_POST_FORM
        || data->state.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_302)) {
      infof(data, "Switch from POST to GET");
      data->state.httpreq = HTTPREQ_GET;
      Curl_creader_set_rewind(data, FALSE);
    }
    break;

  case 303: /* See Other */
    /* 'See Other' location is not the resource but a substitute for the
     * resource. In this case we switch the method to GET/HEAD, unless the
     * method is POST and the user specified to keep it as POST.
     * https://github.com/curl/curl/issues/5237#issuecomment-614641049
     */
    if(data->state.httpreq != HTTPREQ_GET &&
       ((data->state.httpreq != HTTPREQ_POST &&
         data->state.httpreq != HTTPREQ_POST_FORM &&
         data->state.httpreq != HTTPREQ_POST_MIME) ||
        !(data->set.keep_post & CURL_REDIR_POST_303))) {
      data->state.httpreq = HTTPREQ_GET;
      infof(data, "Switch to %s",
            data->req.no_body?"HEAD":"GET");
    }
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We should not get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy. The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTransferSizes(data);

  return CURLE_OK;
#endif /* CURL_DISABLE_HTTP */
}